

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::LoadSettings(SimpleParallelAnalyzerSettings *this,char *settings)

{
  size_type sVar1;
  reference pvVar2;
  reference this_00;
  Channel local_98 [16];
  char local_88 [8];
  char text [64];
  uint local_3c;
  ParallelAnalyzerClockEdge local_38;
  U32 i_1;
  U32 edge;
  U32 i;
  U32 count;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  SimpleParallelAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  sVar1 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mDataChannels);
  edge = (U32)sVar1;
  for (i_1 = 0; i_1 < edge; i_1 = i_1 + 1) {
    pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)i_1);
    SimpleArchive::operator>>(local_20,pvVar2);
  }
  SimpleArchive::operator>>(local_20,&this->mClockChannel);
  SimpleArchive::operator>>(local_20,&local_38);
  this->mClockEdge = local_38;
  AnalyzerSettings::ClearChannels();
  for (local_3c = 0; local_3c < edge; local_3c = local_3c + 1) {
    sprintf(local_88,"D%d",(ulong)local_3c);
    pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)local_3c);
    this_00 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                        (&this->mDataChannels,(ulong)local_3c);
    Channel::Channel(local_98,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_00,local_98);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)pvVar2,SUB81(local_88,0));
    Channel::~Channel(local_98);
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    U32 count = mDataChannels.size();

    for( U32 i = 0; i < count; i++ )
    {
        text_archive >> mDataChannels[ i ];
    }

    text_archive >> mClockChannel;
    U32 edge;
    text_archive >> edge;
    mClockEdge = static_cast<ParallelAnalyzerClockEdge>( edge );

    ClearChannels();
    for( U32 i = 0; i < count; i++ )
    {
        char text[ 64 ];
        sprintf( text, "D%d", i );
        AddChannel( mDataChannels[ i ], text, mDataChannels[ i ] != UNDEFINED_CHANNEL );
    }

    AddChannel( mClockChannel, "Clock", true );

    UpdateInterfacesFromSettings();
}